

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

uint xmlDictHashQName(uint seed,xmlChar *prefix,xmlChar *name,size_t *pplen,size_t *plen)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  byte bVar6;
  
  uVar3 = seed ^ 0x3b00;
  uVar4 = seed << 0xf | seed >> 0x11;
  sVar5 = 0;
  bVar6 = *prefix;
  while (bVar6 != 0) {
    uVar3 = (bVar6 + uVar3) * 9;
    uVar4 = ((uVar4 + uVar3) * 0x80 | uVar4 + uVar3 >> 0x19) * 5;
    lVar2 = sVar5 + 1;
    sVar5 = sVar5 + 1;
    bVar6 = prefix[lVar2];
  }
  *pplen = sVar5;
  uVar4 = uVar3 * 9 + uVar4 + 0x20a;
  uVar4 = uVar4 * 0x80 | uVar4 >> 0x19;
  uVar3 = uVar3 * 9 + 0x20a;
  sVar5 = 0;
  bVar6 = *name;
  while (uVar1 = uVar4 * 5, bVar6 != 0) {
    uVar3 = (bVar6 + uVar3) * 9;
    uVar4 = (uVar1 + uVar3) * 0x80 | uVar1 + uVar3 >> 0x19;
    lVar2 = sVar5 + 1;
    sVar5 = sVar5 + 1;
    bVar6 = name[lVar2];
  }
  uVar3 = (uVar4 * 0x14000 | uVar1 >> 0x12) + (uVar3 ^ uVar1);
  uVar4 = (uVar3 * 0x4000000 | uVar3 >> 6) + (uVar1 ^ uVar3);
  uVar3 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar3 ^ uVar4);
  *plen = sVar5;
  return (uVar3 * 0x1000000 | uVar3 >> 8) + (uVar4 ^ uVar3) | 0x80000000;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static unsigned
xmlDictHashQName(unsigned seed, const xmlChar *prefix, const xmlChar *name,
                 size_t *pplen, size_t *plen) {
    unsigned h1, h2;
    size_t i;

    HASH_INIT(h1, h2, seed);

    for (i = 0; prefix[i] != 0; i++) {
        HASH_UPDATE(h1, h2, prefix[i]);
    }
    *pplen = i;

    HASH_UPDATE(h1, h2, ':');

    for (i = 0; name[i] != 0; i++) {
        HASH_UPDATE(h1, h2, name[i]);
    }
    *plen = i;

    HASH_FINISH(h1, h2);

    /*
     * Always set the upper bit of hash values since 0 means an unoccupied
     * bucket.
     */
    return(h2 | MAX_HASH_SIZE);
}